

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int add_attribute_octet(stack_st_X509_ATTRIBUTE *attrs,int nid,char *buffer,int len)

{
  int iVar1;
  char *pcVar2;
  ASN1_STRING *str;
  X509_ATTRIBUTE *pXVar3;
  
  pcVar2 = OBJ_nid2sn(nid);
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x2c2,"adding octet attribute %s\n",pcVar2);
  str = ASN1_STRING_new();
  iVar1 = ASN1_STRING_set(str,buffer,len);
  if (0 < iVar1) {
    pXVar3 = X509_ATTRIBUTE_create(nid,4,str);
    OPENSSL_sk_push(attrs,pXVar3);
    return 0;
  }
  log_log(4,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x2c6,"error adding data to ASN.1 string");
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int add_attribute_octet (X509_ATTRIBUTE_STACK *attrs, int nid, char *buffer, int len) {
    ASN1_STRING     *asn1_string = NULL;
    X509_ATTRIBUTE  *x509_a;
    int             c;

    log_debug("adding octet attribute %s\n", OBJ_nid2sn(nid));

    asn1_string = ASN1_STRING_new();
    if ((c = ASN1_STRING_set(asn1_string, buffer, len)) <= 0) {
        log_error("error adding data to ASN.1 string");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_OCTET_STRING, asn1_string);
    sk_X509_ATTRIBUTE_push(attrs, x509_a);
    return (0);
}